

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O1

void tcu::anon_unknown_50::computeScaleAndBias
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,Vec4 *scale,
               Vec4 *bias)

{
  float fVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  Vec4 refMax;
  Vec4 refMin;
  float local_68 [4];
  float local_58 [4];
  Vec4 local_48;
  Vec4 local_38;
  
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  estimatePixelValueRange(reference,&local_38,&local_48);
  local_58[0] = local_38.m_data[0];
  local_58[1] = local_38.m_data[1];
  local_58[2] = local_38.m_data[2];
  local_58[3] = local_38.m_data[3];
  local_68[0] = local_48.m_data[0];
  local_68[1] = local_48.m_data[1];
  local_68[2] = local_48.m_data[2];
  local_68[3] = local_48.m_data[3];
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  estimatePixelValueRange(result,&local_38,&local_48);
  local_58[1] = (float)(~-(uint)(local_58[1] <= local_38.m_data[1]) & (uint)local_38.m_data[1] |
                       (uint)local_58[1] & -(uint)(local_58[1] <= local_38.m_data[1]));
  local_58[0] = (float)(~-(uint)(local_58[0] <= local_38.m_data[0]) & (uint)local_38.m_data[0] |
                       (uint)local_58[0] & -(uint)(local_58[0] <= local_38.m_data[0]));
  local_68[1] = (float)(~-(uint)(local_48.m_data[1] <= local_68[1]) & (uint)local_48.m_data[1] |
                       (uint)local_68[1] & -(uint)(local_48.m_data[1] <= local_68[1]));
  local_68[0] = (float)(~-(uint)(local_48.m_data[0] <= local_68[0]) & (uint)local_48.m_data[0] |
                       (uint)local_68[0] & -(uint)(local_48.m_data[0] <= local_68[0]));
  local_68[3] = (float)(~-(uint)(local_48.m_data[3] <= local_68[3]) & (uint)local_48.m_data[3] |
                       (uint)local_68[3] & -(uint)(local_48.m_data[3] <= local_68[3]));
  local_68[2] = (float)(~-(uint)(local_48.m_data[2] <= local_68[2]) & (uint)local_48.m_data[2] |
                       (uint)local_68[2] & -(uint)(local_48.m_data[2] <= local_68[2]));
  local_58[3] = (float)(~-(uint)(local_58[3] <= local_38.m_data[3]) & (uint)local_38.m_data[3] |
                       (uint)local_58[3] & -(uint)(local_58[3] <= local_38.m_data[3]));
  local_58[2] = (float)(~-(uint)(local_58[2] <= local_38.m_data[2]) & (uint)local_38.m_data[2] |
                       (uint)local_58[2] & -(uint)(local_58[2] <= local_38.m_data[2]));
  lVar2 = 0;
  do {
    fVar3 = *(float *)((long)local_68 + lVar2);
    fVar1 = *(float *)((long)local_58 + lVar2);
    fVar4 = fVar3 - fVar1;
    if (0.0001 <= fVar4) {
      fVar4 = 1.0 / fVar4;
      *(float *)((long)scale->m_data + lVar2) = fVar4;
LAB_001d91fd:
      fVar3 = 0.0 - fVar1 * fVar4;
    }
    else {
      fVar4 = (float)(~-(uint)(fVar3 < 0.0001) & (uint)(1.0 / fVar3) |
                     -(uint)(fVar3 < 0.0001) & 0x3f800000);
      *(float *)((long)scale->m_data + lVar2) = fVar4;
      if (lVar2 != 0xc) goto LAB_001d91fd;
      fVar3 = scale->m_data[3] * -local_68[3] + 1.0;
    }
    *(float *)((long)bias->m_data + lVar2) = fVar3;
    lVar2 = lVar2 + 4;
    if (lVar2 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void computeScaleAndBias (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, tcu::Vec4& scale, tcu::Vec4& bias)
{
	Vec4 minVal;
	Vec4 maxVal;
	const float eps = 0.0001f;

	{
		Vec4 refMin;
		Vec4 refMax;
		estimatePixelValueRange(reference, refMin, refMax);

		minVal	= refMin;
		maxVal	= refMax;
	}

	{
		Vec4 resMin;
		Vec4 resMax;

		estimatePixelValueRange(result, resMin, resMax);

		minVal[0] = de::min(minVal[0], resMin[0]);
		minVal[1] = de::min(minVal[1], resMin[1]);
		minVal[2] = de::min(minVal[2], resMin[2]);
		minVal[3] = de::min(minVal[3], resMin[3]);

		maxVal[0] = de::max(maxVal[0], resMax[0]);
		maxVal[1] = de::max(maxVal[1], resMax[1]);
		maxVal[2] = de::max(maxVal[2], resMax[2]);
		maxVal[3] = de::max(maxVal[3], resMax[3]);
	}

	for (int c = 0; c < 4; c++)
	{
		if (maxVal[c] - minVal[c] < eps)
		{
			scale[c]	= (maxVal[c] < eps) ? 1.0f : (1.0f / maxVal[c]);
			bias[c]		= (c == 3) ? (1.0f - maxVal[c]*scale[c]) : (0.0f - minVal[c]*scale[c]);
		}
		else
		{
			scale[c]	= 1.0f / (maxVal[c] - minVal[c]);
			bias[c]		= 0.0f - minVal[c]*scale[c];
		}
	}
}